

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
bind<Catch::ConfigData,std::__cxx11::string>
          (ArgBuilder *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          field,string *placeholder)

{
  BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  BoundArgFunction<Catch::ConfigData> local_28;
  string *local_20;
  string *placeholder_local;
  offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  field_local;
  ArgBuilder *this_local;
  
  local_20 = placeholder;
  placeholder_local = (string *)field;
  field_local = (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 )this;
  this_00 = (BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x10);
  Detail::
  BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::BoundDataMember(this_00,(offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             )placeholder_local);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&local_28,(IArgFunction<Catch::ConfigData> *)this_00);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_28);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_28);
  std::__cxx11::string::operator=
            ((string *)&(this->m_arg->super_CommonArgProperties<Catch::ConfigData>).placeholder,
             (string *)local_20);
  return;
}

Assistant:

void bind(M C::* field, std::string const& placeholder) {
				m_arg->boundField = new Detail::BoundDataMember<C, M>(field);
				m_arg->placeholder = placeholder;
			}